

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_lib.cc
# Opt level: O0

int PEM_read_bio(BIO *bp,char **name,char **header,uchar **data,long *len)

{
  bool bVar1;
  BUF_MEM *pBVar2;
  int iVar3;
  BUF_MEM *str;
  size_t sVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  BUF_MEM *tmpB;
  BUF_MEM *dataB;
  BUF_MEM *headerB;
  BUF_MEM *nameB;
  char buf [256];
  int nohead;
  int hl;
  int bl;
  int k;
  int i;
  int end;
  EVP_ENCODE_CTX ctx;
  long *len_local;
  uchar **data_local;
  char **header_local;
  char **name_local;
  BIO *bp_local;
  
  k = 0;
  nohead = 0;
  buf[0xfc] = '\0';
  buf[0xfd] = '\0';
  buf[0xfe] = '\0';
  buf[0xff] = '\0';
  buf[0xf8] = '\0';
  buf[0xf9] = '\0';
  buf[0xfa] = '\0';
  buf[0xfb] = '\0';
  ctx._48_8_ = len;
  str = BUF_MEM_new();
  dataB = (BUF_MEM *)BUF_MEM_new();
  tmpB = (BUF_MEM *)BUF_MEM_new();
  if (((str == (BUF_MEM *)0x0) || (dataB == (BUF_MEM *)0x0)) || (tmpB == (BUF_MEM *)0x0)) {
    BUF_MEM_free(str);
    BUF_MEM_free((BUF_MEM *)dataB);
    BUF_MEM_free((BUF_MEM *)tmpB);
  }
  else {
    buf[0xf6] = '\0';
    do {
      do {
        bl = BIO_gets(bp,(char *)&nameB,0xfe);
        if (bl < 1) {
          ERR_put_error(9,0,0x6e,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pem/pem_lib.cc"
                        ,0x23f);
          goto LAB_003e6d42;
        }
        while( true ) {
          bVar1 = false;
          if (-1 < bl) {
            bVar1 = buf[(long)bl + -8] < '!';
          }
          if (!bVar1) break;
          bl = bl + -1;
        }
        bl = bl + 1;
        buf[(long)bl + -8] = '\n';
        bl = bl + 1;
        buf[(long)bl + -8] = '\0';
        iVar3 = strncmp((char *)&nameB,"-----BEGIN ",0xb);
      } while (iVar3 != 0);
      sVar4 = strlen(buf + 3);
      bl = (int)sVar4;
      iVar3 = strncmp(buf + (long)(bl + 5) + -8,"-----\n",6);
    } while (iVar3 != 0);
    iVar3 = BUF_MEM_grow(str,(long)(bl + 9));
    if (CONCAT44(extraout_var,iVar3) != 0) {
      OPENSSL_memcpy(str->data,buf + 3,(long)(bl + -6));
      str->data[bl + -6] = '\0';
      buf[0xfc] = '\0';
      buf[0xfd] = '\0';
      buf[0xfe] = '\0';
      buf[0xff] = '\0';
      iVar3 = BUF_MEM_grow((BUF_MEM *)dataB,0x100);
      if (CONCAT44(extraout_var_00,iVar3) != 0) {
        *((BUF_MEM *)dataB)->data = '\0';
        while( true ) {
          bl = BIO_gets(bp,(char *)&nameB,0xfe);
          if (bl < 1) break;
          while( true ) {
            bVar1 = false;
            if (-1 < bl) {
              bVar1 = buf[(long)bl + -8] < '!';
            }
            if (!bVar1) break;
            bl = bl + -1;
          }
          bl = bl + 1;
          buf[(long)bl + -8] = '\n';
          bl = bl + 1;
          buf[(long)bl + -8] = '\0';
          if ((char)nameB == '\n') break;
          iVar3 = BUF_MEM_grow((BUF_MEM *)dataB,(long)(buf._252_4_ + bl + 9));
          if (CONCAT44(extraout_var_01,iVar3) == 0) goto LAB_003e6d42;
          iVar3 = strncmp((char *)&nameB,"-----END ",9);
          if (iVar3 == 0) {
            buf[0xf8] = '\x01';
            buf[0xf9] = '\0';
            buf[0xfa] = '\0';
            buf[0xfb] = '\0';
            break;
          }
          OPENSSL_memcpy(((BUF_MEM *)dataB)->data + (int)buf._252_4_,&nameB,(long)bl);
          ((BUF_MEM *)dataB)->data[buf._252_4_ + bl] = '\0';
          buf._252_4_ = bl + buf._252_4_;
        }
        nohead = 0;
        iVar3 = BUF_MEM_grow((BUF_MEM *)tmpB,0x400);
        if (CONCAT44(extraout_var_02,iVar3) != 0) {
          *((BUF_MEM *)tmpB)->data = '\0';
          if (buf._248_4_ == 0) {
            do {
              bl = BIO_gets(bp,(char *)&nameB,0xfe);
              pBVar2 = (BUF_MEM *)tmpB;
              if (bl < 1) goto LAB_003e6b80;
              while( true ) {
                bVar1 = false;
                if (-1 < bl) {
                  bVar1 = buf[(long)bl + -8] < '!';
                }
                if (!bVar1) break;
                bl = bl + -1;
              }
              bl = bl + 1;
              buf[(long)bl + -8] = '\n';
              bl = bl + 1;
              buf[(long)bl + -8] = '\0';
              if (bl != 0x41) {
                k = 1;
              }
              iVar3 = strncmp((char *)&nameB,"-----END ",9);
              if ((iVar3 == 0) || (0x41 < bl)) goto LAB_003e6b80;
              iVar3 = BUF_MEM_grow_clean((BUF_MEM *)tmpB,(long)(bl + nohead + 9));
              if (CONCAT44(extraout_var_03,iVar3) == 0) goto LAB_003e6d42;
              OPENSSL_memcpy(((BUF_MEM *)tmpB)->data + nohead,&nameB,(long)bl);
              ((BUF_MEM *)tmpB)->data[nohead + bl] = '\0';
              nohead = bl + nohead;
            } while (k == 0);
            nameB._0_1_ = '\0';
            bl = BIO_gets(bp,(char *)&nameB,0xfe);
            if (0 < bl) {
              while( true ) {
                bVar1 = false;
                if (-1 < bl) {
                  bVar1 = buf[(long)bl + -8] < '!';
                }
                if (!bVar1) break;
                bl = bl + -1;
              }
              bl = bl + 1;
              buf[(long)bl + -8] = '\n';
              bl = bl + 1;
              buf[(long)bl + -8] = '\0';
            }
          }
          else {
            nohead._0_1_ = buf[0xfc];
            nohead._1_1_ = buf[0xfd];
            nohead._2_1_ = buf[0xfe];
            nohead._3_1_ = buf[0xff];
            pBVar2 = (BUF_MEM *)dataB;
            dataB = tmpB;
          }
LAB_003e6b80:
          tmpB = (BUF_MEM *)pBVar2;
          sVar4 = strlen(str->data);
          bl = (int)sVar4;
          iVar3 = strncmp((char *)&nameB,"-----END ",9);
          if (((iVar3 == 0) && (iVar3 = strncmp(str->data,buf + 1,(long)bl), iVar3 == 0)) &&
             (iVar3 = strncmp(buf + (long)(bl + 9) + -8,"-----\n",6), iVar3 == 0)) {
            EVP_DecodeInit((EVP_ENCODE_CTX *)&i);
            bl = EVP_DecodeUpdate((EVP_ENCODE_CTX *)&i,(uchar *)tmpB->data,&nohead,
                                  (uchar *)tmpB->data,nohead);
            if (bl < 0) {
              ERR_put_error(9,0,100,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pem/pem_lib.cc"
                            ,0x2ba);
            }
            else {
              bl = EVP_DecodeFinal((EVP_ENCODE_CTX *)&i,(uchar *)(tmpB->data + nohead),&hl);
              if (bl < 0) {
                ERR_put_error(9,0,100,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pem/pem_lib.cc"
                              ,0x2bf);
              }
              else {
                nohead = hl + nohead;
                if (nohead != 0) {
                  *name = str->data;
                  *header = dataB->data;
                  *data = (uchar *)tmpB->data;
                  *(long *)ctx._48_8_ = (long)nohead;
                  OPENSSL_free(str);
                  OPENSSL_free(dataB);
                  OPENSSL_free(tmpB);
                  return 1;
                }
                nohead = 0;
              }
            }
          }
          else {
            ERR_put_error(9,0,0x66,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pem/pem_lib.cc"
                          ,0x2b2);
          }
        }
      }
    }
LAB_003e6d42:
    BUF_MEM_free(str);
    BUF_MEM_free((BUF_MEM *)dataB);
    BUF_MEM_free((BUF_MEM *)tmpB);
  }
  return 0;
}

Assistant:

int PEM_read_bio(BIO *bp, char **name, char **header, unsigned char **data,
                 long *len) {
  EVP_ENCODE_CTX ctx;
  int end = 0, i, k, bl = 0, hl = 0, nohead = 0;
  char buf[256];
  BUF_MEM *nameB;
  BUF_MEM *headerB;
  BUF_MEM *dataB, *tmpB;

  nameB = BUF_MEM_new();
  headerB = BUF_MEM_new();
  dataB = BUF_MEM_new();
  if ((nameB == NULL) || (headerB == NULL) || (dataB == NULL)) {
    BUF_MEM_free(nameB);
    BUF_MEM_free(headerB);
    BUF_MEM_free(dataB);
    return 0;
  }

  buf[254] = '\0';
  for (;;) {
    i = BIO_gets(bp, buf, 254);

    if (i <= 0) {
      OPENSSL_PUT_ERROR(PEM, PEM_R_NO_START_LINE);
      goto err;
    }

    while ((i >= 0) && (buf[i] <= ' ')) {
      i--;
    }
    buf[++i] = '\n';
    buf[++i] = '\0';

    if (strncmp(buf, "-----BEGIN ", 11) == 0) {
      i = strlen(&(buf[11]));

      if (strncmp(&(buf[11 + i - 6]), "-----\n", 6) != 0) {
        continue;
      }
      if (!BUF_MEM_grow(nameB, i + 9)) {
        goto err;
      }
      OPENSSL_memcpy(nameB->data, &(buf[11]), i - 6);
      nameB->data[i - 6] = '\0';
      break;
    }
  }
  hl = 0;
  if (!BUF_MEM_grow(headerB, 256)) {
    goto err;
  }
  headerB->data[0] = '\0';
  for (;;) {
    i = BIO_gets(bp, buf, 254);
    if (i <= 0) {
      break;
    }

    while ((i >= 0) && (buf[i] <= ' ')) {
      i--;
    }
    buf[++i] = '\n';
    buf[++i] = '\0';

    if (buf[0] == '\n') {
      break;
    }
    if (!BUF_MEM_grow(headerB, hl + i + 9)) {
      goto err;
    }
    if (strncmp(buf, "-----END ", 9) == 0) {
      nohead = 1;
      break;
    }
    OPENSSL_memcpy(&(headerB->data[hl]), buf, i);
    headerB->data[hl + i] = '\0';
    hl += i;
  }

  bl = 0;
  if (!BUF_MEM_grow(dataB, 1024)) {
    goto err;
  }
  dataB->data[0] = '\0';
  if (!nohead) {
    for (;;) {
      i = BIO_gets(bp, buf, 254);
      if (i <= 0) {
        break;
      }

      while ((i >= 0) && (buf[i] <= ' ')) {
        i--;
      }
      buf[++i] = '\n';
      buf[++i] = '\0';

      if (i != 65) {
        end = 1;
      }
      if (strncmp(buf, "-----END ", 9) == 0) {
        break;
      }
      if (i > 65) {
        break;
      }
      if (!BUF_MEM_grow_clean(dataB, i + bl + 9)) {
        goto err;
      }
      OPENSSL_memcpy(&(dataB->data[bl]), buf, i);
      dataB->data[bl + i] = '\0';
      bl += i;
      if (end) {
        buf[0] = '\0';
        i = BIO_gets(bp, buf, 254);
        if (i <= 0) {
          break;
        }

        while ((i >= 0) && (buf[i] <= ' ')) {
          i--;
        }
        buf[++i] = '\n';
        buf[++i] = '\0';

        break;
      }
    }
  } else {
    tmpB = headerB;
    headerB = dataB;
    dataB = tmpB;
    bl = hl;
  }
  i = strlen(nameB->data);
  if ((strncmp(buf, "-----END ", 9) != 0) ||
      (strncmp(nameB->data, &(buf[9]), i) != 0) ||
      (strncmp(&(buf[9 + i]), "-----\n", 6) != 0)) {
    OPENSSL_PUT_ERROR(PEM, PEM_R_BAD_END_LINE);
    goto err;
  }

  EVP_DecodeInit(&ctx);
  i = EVP_DecodeUpdate(&ctx, (unsigned char *)dataB->data, &bl,
                       (unsigned char *)dataB->data, bl);
  if (i < 0) {
    OPENSSL_PUT_ERROR(PEM, PEM_R_BAD_BASE64_DECODE);
    goto err;
  }
  i = EVP_DecodeFinal(&ctx, (unsigned char *)&(dataB->data[bl]), &k);
  if (i < 0) {
    OPENSSL_PUT_ERROR(PEM, PEM_R_BAD_BASE64_DECODE);
    goto err;
  }
  bl += k;

  if (bl == 0) {
    goto err;
  }
  *name = nameB->data;
  *header = headerB->data;
  *data = (unsigned char *)dataB->data;
  *len = bl;
  OPENSSL_free(nameB);
  OPENSSL_free(headerB);
  OPENSSL_free(dataB);
  return 1;
err:
  BUF_MEM_free(nameB);
  BUF_MEM_free(headerB);
  BUF_MEM_free(dataB);
  return 0;
}